

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  Vector<char> buffer_00;
  bool bVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000014;
  Bignum *pBVar9;
  uint uVar10;
  char *__assertion;
  int *piVar11;
  ulong factor;
  ulong uVar12;
  uint uVar13;
  double dVar14;
  float fVar15;
  undefined8 in_stack_fffffffffffff720;
  Vector<char> local_8b8;
  Vector<char> buffer_local;
  Bignum numerator;
  Bignum denominator;
  Bignum delta_plus;
  Bignum delta_minus;
  
  buffer_local.start_ = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar11 = buffer._8_8_;
  buffer_local.length_ = (int)buffer.start_;
  if (v <= 0.0) {
    __assertion = "v > 0";
    pcVar5 = 
    "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
    ;
    uVar10 = 0x5b;
LAB_0017dc21:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,uVar10,pcVar5);
  }
  if (((ulong)v & 0x7ff0000000000000) == 0x7ff0000000000000) {
    __assertion = "!Double(v).IsSpecial()";
    pcVar5 = 
    "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
    ;
    uVar10 = 0x5c;
    goto LAB_0017dc21;
  }
  uVar10 = (uint)this;
  if (uVar10 == 1) {
    fVar15 = (float)v;
    if (((double)fVar15 != v) || (NAN((double)fVar15) || NAN(v))) {
      __assertion = "f == v";
      pcVar5 = 
      "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
      ;
      uVar10 = 0x62;
      goto LAB_0017dc21;
    }
    uVar8 = (uint)fVar15 & 0x7fffff;
    uVar13 = uVar8 | 0x800000;
    if ((uint)fVar15 < 0x800000) {
      uVar13 = uVar8;
    }
    iVar4 = -0x95;
    if ((uint)fVar15 >= 0x800000) {
      iVar4 = ((uint)fVar15 >> 0x17) - 0x96;
    }
    bVar1 = 0xffffff < (uint)fVar15 && uVar8 == 0;
    factor = (ulong)uVar13;
  }
  else {
    uVar12 = (ulong)v & 0xfffffffffffff;
    factor = uVar12 | 0x10000000000000;
    iVar4 = (uint)((ulong)v >> 0x34) - 0x433;
    bVar1 = (ulong)v >> 0x35 != 0 && uVar12 == 0;
    if (((ulong)v & 0x7ff0000000000000) == 0) {
      factor = uVar12;
      iVar4 = -0x432;
    }
  }
  if (factor == 0) {
    __assertion = "significand != 0";
    pcVar5 = "int FIX::double_conversion::NormalizedExponent(uint64_t, int)";
    uVar10 = 0x26;
    goto LAB_0017dc21;
  }
  iVar7 = iVar4 + 0x34;
  for (uVar12 = factor; (uVar12 & 0x10000000000000) == 0; uVar12 = uVar12 * 2) {
    iVar7 = iVar7 + -1;
  }
  dVar14 = ceil((double)iVar7 * 0.30102999566398114 + -1e-10);
  uVar13 = (uint)dVar14;
  if ((uVar10 == 2) && ((int)mode < (int)~uVar13)) {
    pcVar5 = Vector<char>::operator[](&buffer_local,0);
    *pcVar5 = '\0';
    *piVar11 = 0;
    *length = -mode;
    return;
  }
  Bignum::Bignum(&numerator);
  Bignum::Bignum(&denominator);
  Bignum::Bignum(&delta_minus);
  Bignum::Bignum(&delta_plus);
  if (iVar4 < 0) {
    if ((int)uVar13 < 0) {
      Bignum::AssignPowerUInt16(&numerator,10,-uVar13);
      if (uVar10 < 2) {
        Bignum::AssignBignum(&delta_plus,&numerator);
        Bignum::AssignBignum(&delta_minus,&numerator);
        Bignum::MultiplyByUInt64(&numerator,factor);
        iVar7 = 1;
        Bignum::AssignUInt16(&denominator,1);
        Bignum::ShiftLeft(&denominator,-iVar4);
        Bignum::ShiftLeft(&numerator,1);
      }
      else {
        Bignum::MultiplyByUInt64(&numerator,factor);
        Bignum::AssignUInt16(&denominator,1);
        iVar7 = -iVar4;
      }
      pBVar9 = &denominator;
      goto LAB_0017d812;
    }
    Bignum::AssignUInt64(&numerator,factor);
    Bignum::AssignPowerUInt16(&denominator,10,uVar13);
    Bignum::ShiftLeft(&denominator,-iVar4);
    if (1 < uVar10) goto LAB_0017d854;
    Bignum::ShiftLeft(&denominator,1);
    Bignum::ShiftLeft(&numerator,1);
    Bignum::AssignUInt16(&delta_plus,1);
    Bignum::AssignUInt16(&delta_minus,1);
LAB_0017d817:
    if (!(bool)(bVar1 ^ 1U | 1 < uVar10)) {
      Bignum::ShiftLeft(&denominator,1);
      Bignum::ShiftLeft(&numerator,1);
      Bignum::ShiftLeft(&delta_plus,1);
    }
  }
  else {
    if ((int)uVar13 < 0) {
      __assert_fail("estimated_power >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x1a7,
                    "void FIX::double_conversion::InitialScaledStartValuesPositiveExponent(uint64_t, int, int, bool, Bignum *, Bignum *, Bignum *, Bignum *)"
                   );
    }
    Bignum::AssignUInt64(&numerator,factor);
    Bignum::ShiftLeft(&numerator,iVar4);
    Bignum::AssignPowerUInt16(&denominator,10,uVar13);
    if (uVar10 < 2) {
      Bignum::ShiftLeft(&denominator,1);
      Bignum::ShiftLeft(&numerator,1);
      Bignum::AssignUInt16(&delta_plus,1);
      Bignum::ShiftLeft(&delta_plus,iVar4);
      pBVar9 = &delta_minus;
      Bignum::AssignUInt16(pBVar9,1);
      iVar7 = iVar4;
LAB_0017d812:
      Bignum::ShiftLeft(pBVar9,iVar7);
      goto LAB_0017d817;
    }
  }
LAB_0017d854:
  iVar4 = Bignum::PlusCompare(&numerator,&delta_plus,&denominator);
  if ((factor & 1) == 0) {
    if (-1 < iVar4) goto LAB_0017d8d2;
LAB_0017d87e:
    *length = uVar13;
    Bignum::Times10(&numerator);
    bVar1 = Bignum::Equal(&delta_minus,&delta_plus);
    Bignum::Times10(&delta_minus);
    if (bVar1) {
      Bignum::AssignBignum(&delta_plus,&delta_minus);
    }
    else {
      Bignum::Times10(&delta_plus);
    }
  }
  else {
    if (iVar4 < 1) goto LAB_0017d87e;
LAB_0017d8d2:
    *length = uVar13 + 1;
  }
  if (uVar10 < 2) {
    local_8b8._12_4_ = buffer_local._12_4_;
    local_8b8.length_ = buffer_local.length_;
    local_8b8.start_ = buffer_local.start_;
    bVar1 = Bignum::Equal(&delta_minus,&delta_plus);
    pBVar9 = &delta_plus;
    if (bVar1) {
      pBVar9 = &delta_minus;
    }
    *piVar11 = 0;
    while( true ) {
      uVar3 = Bignum::DivideModuloIntBignum(&numerator,&denominator);
      if (9 < uVar3) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0xc6,
                      "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                     );
      }
      iVar4 = *piVar11;
      *piVar11 = iVar4 + 1;
      pbVar6 = (byte *)Vector<char>::operator[](&local_8b8,iVar4);
      *pbVar6 = (byte)uVar3 | 0x30;
      if ((factor & 1) == 0) {
        bVar2 = Bignum::LessEqual(&numerator,&delta_minus);
        iVar4 = -1;
      }
      else {
        bVar2 = Bignum::Less(&numerator,&delta_minus);
        iVar4 = 0;
      }
      iVar7 = Bignum::PlusCompare(&numerator,pBVar9,&denominator);
      if ((bVar2 != false) || (iVar4 < iVar7)) break;
      Bignum::Times10(&numerator);
      Bignum::Times10(&delta_minus);
      if (!bVar1) {
        Bignum::Times10(&delta_plus);
      }
    }
    if (bVar2 == true && iVar4 < iVar7) {
      iVar4 = Bignum::PlusCompare(&numerator,&numerator,&denominator);
      if (iVar4 < 0) goto LAB_0017daeb;
      pbVar6 = (byte *)Vector<char>::operator[](&local_8b8,*piVar11 + -1);
      if (iVar4 == 0) {
        if ((*pbVar6 & 1) == 0) goto LAB_0017daeb;
        pcVar5 = Vector<char>::operator[](&local_8b8,*piVar11 + -1);
        if (*pcVar5 == '9') {
          __assert_fail("buffer[(*length) - 1] != \'9\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                        ,0xff,
                        "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                       );
        }
      }
      else if (*pbVar6 == 0x39) {
        __assert_fail("buffer[(*length) - 1] != \'9\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0xf4,
                      "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                     );
      }
    }
    else {
      if (bVar2 != false) goto LAB_0017daeb;
      pcVar5 = Vector<char>::operator[](&local_8b8,*piVar11 + -1);
      if (*pcVar5 == '9') {
        __assert_fail("buffer[(*length) -1] != \'9\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0x10d,
                      "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                     );
      }
    }
    pcVar5 = Vector<char>::operator[](&local_8b8,*piVar11 + -1);
    *pcVar5 = *pcVar5 + '\x01';
    goto LAB_0017daeb;
  }
  if (uVar10 == 2) {
    local_8b8.start_ = buffer_local.start_;
    local_8b8.length_ = buffer_local.length_;
    iVar4 = *length;
    if ((int)mode < -iVar4) {
      *length = -mode;
    }
    else {
      if (-iVar4 != mode) {
        mode = iVar4 + mode;
        goto LAB_0017d90d;
      }
      if (iVar4 + mode != 0) {
        __assert_fail("*decimal_point == -requested_digits",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0x158,
                      "void FIX::double_conversion::BignumToFixed(int, int *, Bignum *, Bignum *, Vector<char>, int *)"
                     );
      }
      Bignum::Times10(&denominator);
      iVar4 = Bignum::PlusCompare(&numerator,&numerator,&denominator);
      if (-1 < iVar4) {
        pcVar5 = Vector<char>::operator[](&local_8b8,0);
        *pcVar5 = '1';
        *piVar11 = 1;
        *length = *length + 1;
        goto LAB_0017daeb;
      }
    }
    *piVar11 = 0;
  }
  else {
    if (uVar10 != 3) {
      abort();
    }
LAB_0017d90d:
    buffer_00._8_8_ = in_stack_fffffffffffff720;
    buffer_00.start_ = (char *)piVar11;
    GenerateCountedDigits
              ((double_conversion *)(ulong)mode,(int)length,(int *)&numerator,&denominator,
               (Bignum *)buffer_local.start_,buffer_00,(int *)(ulong)(uint)buffer_local.length_);
  }
LAB_0017daeb:
  pcVar5 = Vector<char>::operator[](&buffer_local,*piVar11);
  *pcVar5 = '\0';
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}